

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O3

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::async_write
          (connection<websocketpp::config::asio::transport_config> *this,
          vector<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>
          *bufs,write_handler *handler)

{
  pointer *ppcVar1;
  iterator __position;
  element_type *peVar2;
  element_type *peVar3;
  __shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
  _Var4;
  pointer pbVar5;
  __shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
  _Var6;
  undefined1 local_178 [40];
  pointer pcStack_150;
  undefined1 local_148 [16];
  __shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
  local_138;
  __shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
  local_128;
  const_buffer local_118;
  element_type *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  _Alloc_hider _Stack_f8;
  undefined1 local_f0 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  pointer pcStack_b0;
  _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  local_a8;
  _Any_data local_78;
  undefined1 local_68 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  
  pbVar5 = (bufs->
           super__Vector_base<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar5 != (bufs->
                super__Vector_base<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_118.data_ = pbVar5->buf;
      local_118.size_ = pbVar5->len;
      __position._M_current =
           (this->m_bufs).
           super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_bufs).super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::
        _M_realloc_insert<asio::const_buffer>(&this->m_bufs,__position,&local_118);
      }
      else {
        (__position._M_current)->data_ = local_118.data_;
        (__position._M_current)->size_ = local_118.size_;
        ppcVar1 = &(this->m_bufs).
                   super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != (bufs->
                       super__Vector_base<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  peVar2 = (this->super_socket_con_type).m_socket.
           super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar3 = (this->m_strand).super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  get_shared((connection<websocketpp::config::asio::transport_config> *)local_178);
  local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)handle_async_write;
  pcStack_b0 = (pointer)0x0;
  std::function<void_(const_std::error_code_&)>::function
            ((function<void_(const_std::error_code_&)> *)&local_a8,handler);
  local_a8.
  super__Head_base<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_false>
  ._M_head_impl.
  super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_178._0_8_;
  local_a8.
  super__Head_base<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_false>
  ._M_head_impl.
  super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_;
  local_178._0_16_ = ZEXT816(0) << 0x20;
  local_78._M_unused._M_object = local_b8._M_pi;
  local_78._8_8_ = pcStack_b0;
  std::
  _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                 *)local_68,&local_a8);
  local_178._24_8_ = &this->m_write_handler_allocator;
  local_178._32_8_ = local_78._M_unused._M_object;
  pcStack_150 = (pointer)local_78._8_8_;
  std::
  _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                 *)local_148,
                (_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                 *)local_68);
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  if ((_func_void *)local_68._16_8_ != (_func_void *)0x0) {
    (*(code *)local_68._16_8_)
              ((_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                *)local_68,
               (_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                *)local_68,3);
  }
  local_118.data_ = peVar3->service_;
  local_118.size_ = (size_t)peVar3->impl_;
  local_108 = (element_type *)local_178._24_8_;
  local_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._32_8_;
  _Stack_f8._M_p = pcStack_150;
  _Var6 = (__shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
           )(ZEXT816(0) << 0x20);
  local_f0._16_8_ = (code *)0x0;
  local_d8 = local_138._M_refcount._M_pi;
  _Var4 = local_138;
  local_f0._0_16_ = (undefined1  [16])_Var6;
  if (local_138._M_ptr != (element_type *)0x0) {
    local_f0._8_8_ = local_148._8_8_;
    local_f0._0_8_ = local_148._0_8_;
    local_f0._16_8_ = local_138._M_ptr;
    _Var4 = _Var6;
  }
  local_138 = _Var4;
  local_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_ptr;
  p_Stack_c8 = local_128._M_refcount._M_pi;
  local_78._M_unused._M_object =
       (this->m_bufs).super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_128 = _Var6;
  ::asio::detail::
  start_write_buffer_sequence_op<asio::basic_stream_socket<asio::ip::tcp>,std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>,__gnu_cxx::__normal_iterator<asio::const_buffer_const*,std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>>,asio::detail::transfer_all_t,asio::detail::wrapped_handler<asio::io_context::strand,websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&)>,std::error_code_const&,unsigned_long)>>,asio::detail::is_continuation_if_running>>
            (peVar2,&this->m_bufs);
  if (p_Stack_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c8);
  }
  if ((code *)local_f0._16_8_ != (code *)0x0) {
    (*(code *)local_f0._16_8_)(local_f0,local_f0,3);
  }
  if (local_128._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128._M_refcount._M_pi);
  }
  if (local_138._M_ptr != (element_type *)0x0) {
    (*(code *)local_138._M_ptr)
              ((_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                *)local_148,
               (_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                *)local_148,3);
  }
  if (local_a8.
      super__Head_base<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_false>
      ._M_head_impl.
      super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.
               super__Head_base<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_false>
               ._M_head_impl.
               super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((pointer)local_a8.
               super__Tuple_impl<1UL,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
               .super__Head_base<1UL,_std::function<void_(const_std::error_code_&)>,_false>.
               _M_head_impl.super__Function_base._M_manager != (pointer)0x0) {
    (*local_a8.
      super__Tuple_impl<1UL,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .super__Head_base<1UL,_std::function<void_(const_std::error_code_&)>,_false>._M_head_impl.
      super__Function_base._M_manager)(&local_a8,&local_a8,3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
  }
  return;
}

Assistant:

void async_write(std::vector<buffer> const & bufs, write_handler handler) {
        std::vector<buffer>::const_iterator it;

        for (it = bufs.begin(); it != bufs.end(); ++it) {
            m_bufs.push_back(lib::asio::buffer((*it).buf,(*it).len));
        }

        if (config::enable_multithreading) {
            lib::asio::async_write(
                socket_con_type::get_socket(),
                m_bufs,
                m_strand->wrap(make_custom_alloc_handler(
                    m_write_handler_allocator,
                    lib::bind(
                        &type::handle_async_write, get_shared(),
                        handler,
                        lib::placeholders::_1, lib::placeholders::_2
                    )
                ))
            );
        } else {
            lib::asio::async_write(
                socket_con_type::get_socket(),
                m_bufs,
                make_custom_alloc_handler(
                    m_write_handler_allocator,
                    lib::bind(
                        &type::handle_async_write, get_shared(),
                        handler,
                        lib::placeholders::_1, lib::placeholders::_2
                    )
                )
            );
        }
    }